

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::MultiAggregationPS::MultiAggregationPS
          (MultiAggregationPS *this,MultiAggregationPS *old)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006ab348;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar2 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__MultiAggregationPS_006abe58;
  iVar2 = old->m_i;
  iVar3 = old->m_old_j;
  iVar4 = old->m_old_i;
  this->m_j = old->m_j;
  this->m_i = iVar2;
  this->m_old_j = iVar3;
  this->m_old_i = iVar4;
  dVar1 = old->m_lower;
  this->m_upper = old->m_upper;
  this->m_lower = dVar1;
  dVar1 = old->m_const;
  this->m_obj = old->m_obj;
  this->m_const = dVar1;
  this->m_onLhs = old->m_onLhs;
  this->m_eqCons = old->m_eqCons;
  DSVectorBase<double>::DSVectorBase(&this->m_row,&old->m_row);
  DSVectorBase<double>::DSVectorBase(&this->m_col,&old->m_col);
  return;
}

Assistant:

MultiAggregationPS(const MultiAggregationPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_i(old.m_i)
         , m_old_j(old.m_old_j)
         , m_old_i(old.m_old_i)
         , m_upper(old.m_upper)
         , m_lower(old.m_lower)
         , m_obj(old.m_obj)
         , m_const(old.m_const)
         , m_onLhs(old.m_onLhs)
         , m_eqCons(old.m_eqCons)
         , m_row(old.m_row)
         , m_col(old.m_col)
      {}